

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O0

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  double dVar1;
  bool bVar2;
  float *pfVar3;
  Mat *pMVar4;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_4;
  Mat m;
  float *ptr_2;
  int q_2;
  int j;
  int i_3;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  Option opt_b;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  int i_2;
  float *ptr_1;
  int i_1;
  float *sptr;
  int p;
  float *ssptr;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  Mat *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  float in_stack_fffffffffffffb3c;
  float in_stack_fffffffffffffb40;
  float in_stack_fffffffffffffb44;
  size_type in_stack_fffffffffffffb48;
  Mat *in_stack_fffffffffffffb50;
  int iVar5;
  Mat *in_stack_fffffffffffffb58;
  undefined8 in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  int in_stack_fffffffffffffb70;
  float fVar6;
  int in_stack_fffffffffffffb74;
  Mat *in_stack_fffffffffffffb78;
  Mat *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  int local_430;
  float local_42c;
  int local_420;
  int local_41c;
  Mat local_418;
  Mat local_3d0;
  Mat *local_388;
  int local_380;
  int local_37c;
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  reference local_368;
  vector<int,_std::allocator<int>_> local_358;
  float local_340;
  int local_33c;
  Mat local_338;
  int local_2c4;
  int local_2c0;
  int local_2a4;
  int local_2a0;
  int local_29c;
  Mat local_298;
  float *local_250;
  int local_244;
  Mat local_240;
  float *local_1f8;
  int local_1ec;
  Mat local_1e8;
  float *local_1a0;
  int local_198;
  float local_194;
  Mat local_190;
  int local_144;
  Mat local_140;
  float *local_f8;
  Mat local_f0;
  float *local_a8;
  int local_9c;
  int local_98;
  Mat local_88;
  int local_3c;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  int local_4;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RSI + 0x38);
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = local_24 * local_28;
  local_20 = in_RDX;
  ncnn::Mat::Mat(&local_88);
  ncnn::Mat::create(in_stack_fffffffffffffb50,(int)(in_stack_fffffffffffffb48 >> 0x20),
                    (int)in_stack_fffffffffffffb48,(int)in_stack_fffffffffffffb44,
                    CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                    (Allocator *)in_stack_fffffffffffffb30);
  bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffb30);
  if (bVar2) {
    local_4 = -100;
    local_98 = 1;
    goto LAB_004accb1;
  }
  local_9c = 0;
  while( true ) {
    iVar5 = (int)in_stack_fffffffffffffb90;
    fVar6 = (float)((ulong)in_stack_fffffffffffffb60 >> 0x20);
    if (local_2c <= local_9c) break;
    ncnn::Mat::channel(in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_f0);
    ncnn::Mat::~Mat((Mat *)0x4ac096);
    local_a8 = pfVar3;
    ncnn::Mat::channel(in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_140);
    ncnn::Mat::~Mat((Mat *)0x4ac0e5);
    for (local_144 = 0; local_144 < local_3c; local_144 = local_144 + 1) {
      pfVar3[local_144] = local_a8[local_144] * local_a8[local_144];
    }
    local_9c = local_9c + 1;
    local_f8 = pfVar3;
  }
  if (*(int *)(in_RDI + 0xd0) == 0) {
    ncnn::Mat::Mat(&local_190);
    ncnn::Mat::create(in_stack_fffffffffffffb50,(int)(in_stack_fffffffffffffb48 >> 0x20),
                      (int)in_stack_fffffffffffffb48,(int)in_stack_fffffffffffffb44,
                      CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                      (Allocator *)in_stack_fffffffffffffb30);
    bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffb30);
    if (bVar2) {
      local_4 = -100;
      local_98 = 1;
    }
    else {
      ncnn::Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                      in_stack_fffffffffffffb3c);
      local_194 = *(float *)(in_RDI + 0xd8) / (float)*(int *)(in_RDI + 0xd4);
      for (local_198 = 0; local_198 < local_2c; local_198 = local_198 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20)
                          );
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_1e8);
        ncnn::Mat::~Mat((Mat *)0x4ac309);
        local_1a0 = pfVar3;
        for (local_1ec = local_198 - *(int *)(in_RDI + 0xd4) / 2;
            iVar5 = (int)((ulong)in_stack_fffffffffffffb50 >> 0x20),
            local_1ec <= local_198 + *(int *)(in_RDI + 0xd4) / 2; local_1ec = local_1ec + 1) {
          if ((-1 < local_1ec) && (local_1ec < local_2c)) {
            ncnn::Mat::channel(in_stack_fffffffffffffb58,iVar5);
            pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_240);
            ncnn::Mat::~Mat((Mat *)0x4ac402);
            for (local_244 = 0; local_1f8 = pfVar3, local_244 < local_3c; local_244 = local_244 + 1)
            {
              local_1a0[local_244] = pfVar3[local_244] + local_1a0[local_244];
            }
          }
        }
        ncnn::Mat::channel(in_stack_fffffffffffffb58,iVar5);
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_298);
        ncnn::Mat::~Mat((Mat *)0x4ac4e9);
        local_250 = pfVar3;
        for (local_29c = 0; local_29c < local_3c; local_29c = local_29c + 1) {
          fVar6 = local_250[local_29c];
          dVar1 = std::pow((double)(ulong)(uint)(*(float *)(in_RDI + 0xe0) +
                                                local_194 * local_1a0[local_29c]),
                           (double)((ulong)*(uint *)(in_RDI + 0xdc) ^ 0x8000000080000000));
          local_250[local_29c] = fVar6 * SUB84(dVar1,0);
        }
      }
      local_98 = 0;
    }
    ncnn::Mat::~Mat((Mat *)0x4ac60c);
joined_r0x004acc77:
    if (local_98 != 0) goto LAB_004accb1;
  }
  else if (*(int *)(in_RDI + 0xd0) == 1) {
    local_2a0 = local_24;
    local_2a4 = local_28;
    ncnn::Mat::Mat(in_stack_fffffffffffffb30,
                   (Mat *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    local_338.cstep._4_4_ = *(int *)(in_RDI + 0xd4) / 2;
    if (local_338.cstep._4_4_ < 1) {
LAB_004ac7bb:
      local_33c = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd4);
      local_340 = *(float *)(in_RDI + 0xd8) / (float)local_33c;
      pMVar4 = (Mat *)(long)local_33c;
      std::allocator<int>::allocator((allocator<int> *)0x4ac810);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50,
                 in_stack_fffffffffffffb48,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      std::allocator<int>::~allocator((allocator<int> *)0x4ac836);
      local_368 = std::vector<int,_std::allocator<int>_>::operator[](&local_358,0);
      local_36c = 0;
      local_370 = 0;
      local_374 = local_24 - *(int *)(in_RDI + 0xd4);
      for (local_378 = 0; local_378 < *(int *)(in_RDI + 0xd4); local_378 = local_378 + 1) {
        for (local_37c = 0; local_37c < *(int *)(in_RDI + 0xd4); local_37c = local_37c + 1) {
          local_368[local_36c] = local_370;
          local_36c = local_36c + 1;
          local_370 = local_370 + 1;
        }
        local_370 = local_374 + local_370;
      }
      for (local_380 = 0; local_380 < local_2c; local_380 = local_380 + 1) {
        ncnn::Mat::channel(pMVar4,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
        in_stack_fffffffffffffb50 = (Mat *)ncnn::Mat::operator_cast_to_float_(&local_3d0);
        ncnn::Mat::~Mat((Mat *)0x4ac9c7);
        local_388 = in_stack_fffffffffffffb50;
        ncnn::Mat::channel(pMVar4,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
        for (local_41c = 0; local_41c < local_2a4; local_41c = local_41c + 1) {
          for (local_420 = 0; local_420 < local_2a0; local_420 = local_420 + 1) {
            pfVar3 = ncnn::Mat::row(&local_418,local_41c);
            local_42c = 0.0;
            for (local_430 = 0; local_430 < local_33c; local_430 = local_430 + 1) {
              local_42c = pfVar3[(long)local_420 + (long)local_368[local_430]] + local_42c;
            }
            in_stack_fffffffffffffb40 = *(float *)((long)&local_388->data + (long)local_420 * 4);
            dVar1 = std::pow((double)(ulong)(uint)(*(float *)(in_RDI + 0xe0) + local_340 * local_42c
                                                  ),
                             (double)((ulong)*(uint *)(in_RDI + 0xdc) ^ 0x8000000080000000));
            in_stack_fffffffffffffb44 = SUB84(dVar1,0);
            *(float *)((long)&local_388->data + (long)local_420 * 4) =
                 in_stack_fffffffffffffb40 * in_stack_fffffffffffffb44;
          }
          local_388 = (Mat *)((long)&local_388->data + (long)local_2a0 * 4);
        }
        ncnn::Mat::~Mat((Mat *)0x4acc33);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      local_98 = 0;
    }
    else {
      local_338.data = (void *)*local_20;
      local_338.elemsize._0_4_ = *(undefined4 *)(local_20 + 2);
      local_338.elemsize._4_4_ = *(undefined4 *)((long)local_20 + 0x14);
      local_338.elempack = *(int *)(local_20 + 3);
      local_338._28_4_ = *(undefined4 *)((long)local_20 + 0x1c);
      local_338._40_8_ = local_20[5];
      local_338._48_8_ = local_20[6];
      local_338._56_8_ = local_20[7];
      local_338.refcount = (int *)local_20[2];
      local_338.allocator = (Allocator *)(local_20[4] & 0xffffffffffffff);
      pMVar4 = &local_338;
      copy_make_border(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb74
                       ,in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                       in_stack_fffffffffffffb68,iVar5,fVar6,
                       (Option *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
      bVar2 = ncnn::Mat::empty(pMVar4);
      if (!bVar2) {
        local_24 = local_2c4;
        local_28 = local_2c0;
        goto LAB_004ac7bb;
      }
      local_4 = -100;
      local_98 = 1;
    }
    ncnn::Mat::~Mat((Mat *)0x4acc6e);
    goto joined_r0x004acc77;
  }
  local_4 = 0;
  local_98 = 1;
LAB_004accb1:
  ncnn::Mat::~Mat((Mat *)0x4accbe);
  return local_4;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i = 0; i < size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta));
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            opt_b.use_packing_layout = false;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = static_cast<float>(ptr[j] * pow(bias + alpha_div_size * ss, -beta));
                }

                ptr += outw;
            }
        }
    }

    return 0;
}